

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::UniqueMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  ON_Mesh *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<const_ON_Mesh> *psVar2;
  undefined1 local_29;
  shared_ptr<const_ON_Mesh> local_28;
  
  psVar2 = SharedMesh(this,mesh_type);
  __args = (psVar2->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((__args != (ON_Mesh *)0x0) &&
      (p_Var1 = (psVar2->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
     (1 < p_Var1->_M_use_count)) {
    local_28.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ON_Mesh_const,std::allocator<ON_Mesh>,ON_Mesh_const&>
              (&local_28.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (ON_Mesh **)&local_28,(allocator<ON_Mesh> *)&local_29,__args);
    SetMesh(this,mesh_type,&local_28);
    if (local_28.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    psVar2 = SharedMesh(this,mesh_type);
  }
  return psVar2;
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::UniqueMesh(ON::mesh_type mesh_type)
{
  const auto& sp = SharedMesh(mesh_type);

  if (sp && sp.use_count() > 1)
  {
    SetMesh(mesh_type, std::make_shared<const ON_Mesh>(*sp));
    return SharedMesh(mesh_type);
  }

  return sp;
}